

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O0

int mbedtls_camellia_crypt_cfb128
              (mbedtls_camellia_context *ctx,int mode,size_t length,size_t *iv_off,uchar *iv,
              uchar *input,uchar *output)

{
  byte bVar1;
  byte bVar2;
  ulong local_48;
  size_t n;
  byte *pbStack_38;
  int c;
  uchar *input_local;
  uchar *iv_local;
  size_t *iv_off_local;
  size_t length_local;
  int mode_local;
  mbedtls_camellia_context *ctx_local;
  
  local_48 = *iv_off;
  pbStack_38 = input;
  iv_off_local = (size_t *)length;
  if (mode == 0) {
    while (iv_off_local != (size_t *)0x0) {
      if (local_48 == 0) {
        mbedtls_camellia_crypt_ecb(ctx,1,iv,iv);
      }
      bVar1 = *pbStack_38;
      *output = bVar1 ^ iv[local_48];
      iv[local_48] = bVar1;
      local_48 = local_48 + 1 & 0xf;
      output = output + 1;
      pbStack_38 = pbStack_38 + 1;
      iv_off_local = (size_t *)((long)iv_off_local + -1);
    }
  }
  else {
    while (iv_off_local != (size_t *)0x0) {
      if (local_48 == 0) {
        mbedtls_camellia_crypt_ecb(ctx,1,iv,iv);
      }
      bVar1 = iv[local_48];
      bVar2 = *pbStack_38;
      *output = bVar1 ^ bVar2;
      iv[local_48] = bVar1 ^ bVar2;
      local_48 = local_48 + 1 & 0xf;
      output = output + 1;
      pbStack_38 = pbStack_38 + 1;
      iv_off_local = (size_t *)((long)iv_off_local + -1);
    }
  }
  *iv_off = local_48;
  return 0;
}

Assistant:

int mbedtls_camellia_crypt_cfb128( mbedtls_camellia_context *ctx,
                       int mode,
                       size_t length,
                       size_t *iv_off,
                       unsigned char iv[16],
                       const unsigned char *input,
                       unsigned char *output )
{
    int c;
    size_t n = *iv_off;

    if( mode == MBEDTLS_CAMELLIA_DECRYPT )
    {
        while( length-- )
        {
            if( n == 0 )
                mbedtls_camellia_crypt_ecb( ctx, MBEDTLS_CAMELLIA_ENCRYPT, iv, iv );

            c = *input++;
            *output++ = (unsigned char)( c ^ iv[n] );
            iv[n] = (unsigned char) c;

            n = ( n + 1 ) & 0x0F;
        }
    }
    else
    {
        while( length-- )
        {
            if( n == 0 )
                mbedtls_camellia_crypt_ecb( ctx, MBEDTLS_CAMELLIA_ENCRYPT, iv, iv );

            iv[n] = *output++ = (unsigned char)( iv[n] ^ *input++ );

            n = ( n + 1 ) & 0x0F;
        }
    }

    *iv_off = n;

    return( 0 );
}